

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  bbox2d bbox;
  c_polygon poly;
  obb bbox_WXH;
  obb min_peri_bbox;
  obb min_area_bbox;
  bbox2d local_2d8;
  string local_2c0;
  string local_2a0;
  string local_280;
  c_polygon local_260;
  bbox2d_problem local_1f0;
  undefined4 local_1a0;
  obb local_198;
  obb local_150;
  obb local_108;
  contained_bbox local_c0;
  bbox2d_problem local_68;
  undefined4 local_18;
  
  if (argc == 2) {
    local_260.super_c_plylist.
    super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&local_260;
    local_260.super_c_plylist.
    super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    _M_size = 0;
    local_260.super_c_plylist.center.v[0] = 0.0;
    local_260.super_c_plylist.center.v[1] = 0.0;
    local_260.super_c_plylist.box[0] = 0.0;
    local_260.super_c_plylist.box[1] = 0.0;
    local_260.super_c_plylist.box[2]._0_2_ = 0;
    local_260.super_c_plylist.box[2]._2_6_ = 0;
    local_260.super_c_plylist.box[3]._0_2_ = 0;
    local_260.super_c_plylist._66_8_ = 0;
    local_260.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_260.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_260.all.
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_260.area = 0.0;
    local_260.arclength = 0.0;
    local_260.super_c_plylist.
    super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
    super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         local_260.super_c_plylist.
         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    std::__cxx11::string::string((string *)&local_1f0,argv[1],(allocator *)&local_68);
    createPoly((string *)&local_1f0,&local_260);
    if (local_1f0._vptr_bbox2d_problem != (_func_int **)(local_1f0.m_solution.corners[0].v + 1)) {
      operator_delete(local_1f0._vptr_bbox2d_problem);
    }
    masc::polygon::bbox2d::bbox2d(&local_2d8,&local_260);
    local_1f0.m_solution.corners[3].v[0] = 0.0;
    local_1f0.m_solution.corners[3].v[1] = 0.0;
    local_1f0.m_solution.corners[2].v[0] = 0.0;
    local_1f0.m_solution.corners[2].v[1] = 0.0;
    local_1f0.m_solution.corners[1].v[0] = 0.0;
    local_1f0.m_solution.corners[1].v[1] = 0.0;
    local_1f0.m_solution.corners[0].v[0] = 0.0;
    local_1f0.m_solution.corners[0].v[1] = 0.0;
    local_1f0.m_solution.width = 3.4028235e+38;
    local_1f0.m_solution.height = 3.4028235e+38;
    local_1f0._vptr_bbox2d_problem = (_func_int **)&PTR_solved_0010fbe0;
    local_1a0 = 0x7f7fffff;
    masc::polygon::bbox2d::build(&local_108,&local_2d8,&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BBox with min area: ",0x14);
    poVar3 = masc::polygon::operator<<((ostream *)&std::cout,&local_108);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"min_area_bbox.svg","");
    masc::polygon::saveSVG
              (&local_280,
               (c_ply *)&(((c_plylist *)
                          &(local_260.super_c_plylist.
                            super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                            super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                            ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->
                         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>).
                         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                         ._M_impl._M_node._M_size,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    local_68.m_solution.corners[3].v[0] = 0.0;
    local_68.m_solution.corners[3].v[1] = 0.0;
    local_68.m_solution.corners[2].v[0] = 0.0;
    local_68.m_solution.corners[2].v[1] = 0.0;
    local_68.m_solution.corners[1].v[0] = 0.0;
    local_68.m_solution.corners[1].v[1] = 0.0;
    local_68.m_solution.corners[0].v[0] = 0.0;
    local_68.m_solution.corners[0].v[1] = 0.0;
    local_68.m_solution.width = 3.4028235e+38;
    local_68.m_solution.height = 3.4028235e+38;
    local_68._vptr_bbox2d_problem = (_func_int **)&PTR_solved_0010fc10;
    local_18 = 0x7f7fffff;
    masc::polygon::bbox2d::build(&local_150,&local_2d8,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BBox with min perimeter: ",0x19);
    poVar3 = masc::polygon::operator<<((ostream *)&std::cout,&local_150);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a0,"min_perimeter_bbox.svg","");
    masc::polygon::saveSVG
              (&local_2a0,
               (c_ply *)&(((c_plylist *)
                          &(local_260.super_c_plylist.
                            super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                            super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                            ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->
                         super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>).
                         super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                         ._M_impl._M_node._M_size,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    local_c0.super_bbox2d_problem.m_solution.corners[3].v[0] = 0.0;
    local_c0.super_bbox2d_problem.m_solution.corners[3].v[1] = 0.0;
    local_c0.super_bbox2d_problem.m_solution.corners[2].v[0] = 0.0;
    local_c0.super_bbox2d_problem.m_solution.corners[2].v[1] = 0.0;
    local_c0.super_bbox2d_problem.m_solution.corners[1].v[0] = 0.0;
    local_c0.super_bbox2d_problem.m_solution.corners[1].v[1] = 0.0;
    local_c0.super_bbox2d_problem.m_solution.corners[0].v[0] = 0.0;
    local_c0.super_bbox2d_problem.m_solution.corners[0].v[1] = 0.0;
    local_c0.super_bbox2d_problem._vptr_bbox2d_problem = (_func_int **)&PTR_solved_0010fc40;
    local_c0.super_bbox2d_problem.m_solution.width = 3.4028235e+38;
    local_c0.super_bbox2d_problem.m_solution.height = 3.4028235e+38;
    local_c0.m_width = 28.0;
    local_c0.m_height = 28.0;
    masc::polygon::bbox2d::build(&local_198,&local_2d8,&local_c0.super_bbox2d_problem);
    bVar1 = masc::polygon::contained_bbox::solved(&local_c0,&local_198);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"BBox contained in ",0x12);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"X",1);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," square: ",9);
      poVar3 = masc::polygon::operator<<(poVar3,&local_198);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"contained_bbox.svg","");
      masc::polygon::saveSVG
                (&local_2c0,
                 (c_ply *)&(((c_plylist *)
                            &(local_260.super_c_plylist.
                              super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                              .
                              super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                              ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->
                           super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>).
                           super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                           ._M_impl._M_node._M_size,&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"! Error: Cannot find a bounding box that fits into ",0x33);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"X",1);
      poVar3 = std::ostream::_M_insert<double>(28.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," square",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if (local_2d8.m_chull.
        super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.m_chull.
                      super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_260.all.
        super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.all.
                      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::_List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::_M_clear
              ((_List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)&local_260
              );
    iVar2 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1111f0);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," polygon",8);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char ** argv)
{
  if(argc!=2)
  {
    cerr<<"Usage: "<<argv[0]<<" polygon"<<endl;
    return 1;
  }

  //create polygon
  masc::polygon::c_polygon poly;
  createPoly(argv[1],poly);

  //create bbox of the polygon
  masc::polygon::bbox2d bbox(poly);

  //create min-area bbox
  masc::polygon::min_area_bbox p1;
  masc::polygon::obb min_area_bbox = bbox.build(p1);
  cout<<"BBox with min area: "<<min_area_bbox<<endl;
  saveSVG("min_area_bbox.svg",poly.front(),min_area_bbox);

  //build min-perimeter box
  masc::polygon::min_perimeter_bbox p2;
  masc::polygon::obb min_peri_bbox = bbox.build(p2);
  cout<<"BBox with min perimeter: "<<min_peri_bbox<<endl;
  saveSVG("min_perimeter_bbox.svg",poly.front(),min_peri_bbox);

  //build a box that fits into 13X13 square
  float W=28, H=28;
  masc::polygon::contained_bbox p3(W,H);
  masc::polygon::obb bbox_WXH = bbox.build(p3);
  if(p3.solved(bbox_WXH)==false)
    cerr<<"! Error: Cannot find a bounding box that fits into "<<W<<"X"<<H<<" square"<<endl;
  else
  {
    cout<<"BBox contained in "<<W<<"X"<<H<<" square: "<<bbox_WXH<<endl;
    saveSVG("contained_bbox.svg",poly.front(),bbox_WXH);
  }

  return 0;
}